

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O2

void __thiscall amrex::ForkJoin::create_task_output_dir(ForkJoin *this)

{
  string *__lhs;
  ostringstream *poVar1;
  bool bVar2;
  ostream *os_;
  Print local_1a0;
  
  __lhs = &this->task_output_dir;
  bVar2 = std::operator!=(__lhs,"");
  if (bVar2) {
    bVar2 = FileExists(__lhs);
    if (!bVar2) {
      if (this->flag_verbose == true) {
        os_ = OutStream();
        Print::Print(&local_1a0,os_);
        poVar1 = &local_1a0.ss;
        std::operator<<((ostream *)poVar1,"Creating task_output_dir: ");
        std::operator<<((ostream *)poVar1,(string *)__lhs);
        std::endl<char,std::char_traits<char>>((ostream *)poVar1);
        Print::~Print(&local_1a0);
      }
      if (*(int *)(DAT_006e0650 + -0x3c) == *(int *)(DAT_006e0650 + -0x30)) {
        UtilCreateDirectory(__lhs,0x1ed,this->flag_verbose);
      }
    }
  }
  return;
}

Assistant:

void ForkJoin::create_task_output_dir ()
{
    if (task_output_dir != "" && !amrex::FileExists(task_output_dir)) {
        if (flag_verbose) {
            Print() << "Creating task_output_dir: " << task_output_dir << std::endl;
        }
        if (ParallelContext::IOProcessorSub()) {
            amrex::UtilCreateDirectory(task_output_dir, 0755, flag_verbose);
        }
    }
}